

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

ValueType * __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::operator[]
          (HighsHashTable<int,_std::pair<double,_int>_> *this,KeyType_conflict *key)

{
  uchar uVar1;
  _Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false> _Var2;
  uchar *puVar3;
  undefined8 uVar4;
  bool bVar5;
  ValueType *pVVar6;
  ulong uVar7;
  ulong uVar8;
  KeyType_conflict KVar9;
  int iVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  uchar local_59;
  ulong local_58;
  HighsHashTableEntry<int,_std::pair<double,_int>_> local_50;
  ulong local_38;
  ulong local_30;
  
  _Var2._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>.
       _M_head_impl;
  bVar5 = findPosition(this,key,&local_59,&local_30,&local_38,&local_58);
  if (bVar5) {
    return (ValueType *)((long)(_Var2._M_head_impl + local_58) + 8);
  }
  uVar7 = this->tableSizeMask;
  if ((this->numElements == uVar7 * 7 + 7 >> 3) || (local_58 == local_38)) {
    growTable(this);
  }
  else {
    uVar4 = _Var2._M_head_impl + local_58;
    KVar9 = *key;
    local_50.value_.first = 0.0;
    local_50.value_.second = 0;
    this->numElements = this->numElements + 1;
    uVar12 = 0;
    uVar13 = 0;
    iVar10 = 0;
    uVar8 = local_38;
    local_50.key_ = KVar9;
    do {
      puVar3 = (this->metadata)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      if (-1 < (char)puVar3[local_58]) {
        puVar3[local_58] = local_59;
        *(ulong *)((long)(_Var2._M_head_impl + local_58) + 0x10) =
             CONCAT44(local_50.value_._12_4_,local_50.value_.second);
        *(ulong *)(_Var2._M_head_impl + local_58) = CONCAT44(local_50._4_4_,local_50.key_);
        _Var2._M_head_impl[local_58].value_.first = local_50.value_.first;
        return (ValueType *)(uVar4 + 8);
      }
      uVar11 = (ulong)((int)local_58 - (uint)puVar3[local_58] & 0x7f);
      if (uVar11 < (local_58 - local_30 & uVar7)) {
        local_50.key_ = _Var2._M_head_impl[local_58].key_;
        local_50.value_.first = *(double *)((long)(_Var2._M_head_impl + local_58) + 8);
        local_50.value_.second = *(int *)((long)(_Var2._M_head_impl + local_58) + 0x10);
        _Var2._M_head_impl[local_58].key_ = KVar9;
        *(ulong *)((long)(_Var2._M_head_impl + local_58) + 8) = CONCAT44(uVar13,uVar12);
        *(int *)((long)(_Var2._M_head_impl + local_58) + 0x10) = iVar10;
        uVar1 = puVar3[local_58];
        puVar3[local_58] = local_59;
        uVar7 = this->tableSizeMask;
        local_30 = local_58 - uVar11 & uVar7;
        uVar8 = local_30 + 0x7f & uVar7;
        uVar12 = SUB84(local_50.value_.first,0);
        uVar13 = (undefined4)((ulong)local_50.value_.first >> 0x20);
        KVar9 = local_50.key_;
        iVar10 = local_50.value_.second;
        local_59 = uVar1;
        local_38 = uVar8;
      }
      local_58 = local_58 + 1 & uVar7;
    } while (local_58 != uVar8);
    growTable(this);
    HighsHashTable<int,std::pair<double,int>>::
    insert<HighsHashTableEntry<int,std::pair<double,int>>>
              ((HighsHashTable<int,std::pair<double,int>> *)this,&local_50);
  }
  pVVar6 = operator[](this,key);
  return pVVar6;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }